

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point.cc
# Opt level: O2

Point __thiscall Point::traverse(Point *this,Point *traversal)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = (ulong)this->row;
  if ((ulong)traversal->row == 0) {
    uVar2 = (ulong)traversal->column + (ulong)this->column;
    if (0xfffffffe < uVar2) {
      uVar2 = 0xffffffff;
    }
  }
  else {
    uVar1 = uVar1 + traversal->row;
    if (0xfffffffe < uVar1) {
      uVar1 = 0xffffffff;
    }
    uVar2 = (ulong)traversal->column;
  }
  return (Point)(uVar1 & 0xffffffff | uVar2 << 0x20);
}

Assistant:

Point Point::traverse (const Point &traversal) const {
    if (traversal.row == 0) {
        return Point(row, checked_add(column, traversal.column));
    } else {
        return Point(checked_add(row, traversal.row), traversal.column);
    }
}